

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O3

void __thiscall
TPZCondensedCompEl::TPZCondensedCompEl
          (TPZCondensedCompEl *this,TPZCondensedCompEl *copy,TPZCompMesh *mesh)

{
  TPZManVector<long,_62> *this_00;
  long *plVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  TPZCompEl *this_01;
  TPZCompMesh *pTVar4;
  TPZGeoEl *pTVar5;
  TPZCompEl **ppTVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  *(undefined ***)&this->super_TPZCompEl = &PTR__TPZSavable_0193c968;
  TPZCompEl::TPZCompEl(&this->super_TPZCompEl,&PTR_PTR_0193c648);
  *(undefined ***)&this->super_TPZCompEl = &PTR__TPZCondensedCompEl_0193c3f8;
  this->fNumInternalEqs = 0;
  this->fNumTotalEqs = 0;
  TPZMatRed<double,_TPZFMatrix<double>_>::TPZMatRed(&this->fCondensed);
  this_00 = &this->fIndexes;
  TPZVec<long>::TPZVec(&this_00->super_TPZVec<long>,0);
  (this->fIndexes).super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0193d398;
  (this->fIndexes).super_TPZVec<long>.fStore = (this->fIndexes).fExtAlloc;
  (this->fIndexes).super_TPZVec<long>.fNElements = 0;
  (this->fIndexes).super_TPZVec<long>.fNAlloc = 0;
  TPZVec<long>::TPZVec(&(this->fCondensedConnectIndexes).super_TPZVec<long>,0);
  (this->fCondensedConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0193d3f0;
  (this->fCondensedConnectIndexes).super_TPZVec<long>.fStore =
       (this->fCondensedConnectIndexes).fExtAlloc;
  (this->fCondensedConnectIndexes).super_TPZVec<long>.fNElements = 0;
  (this->fCondensedConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  TPZManVector<long,_10>::TPZManVector(&this->fActiveConnectIndexes,0);
  this->fKeepMatrix = true;
  this_01 = (TPZCompEl *)
            (**(code **)(*(long *)this->fReferenceCompEl + 0x48))(this->fReferenceCompEl,mesh);
  if (this_01 == (TPZCompEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcondensedcompel.cpp"
               ,0x55);
  }
  this->fReferenceCompEl = this_01;
  pTVar4 = TPZCompEl::Mesh(this_01);
  (this->super_TPZCompEl).fMesh = pTVar4;
  this->fKeepMatrix = copy->fKeepMatrix;
  pTVar5 = TPZCompEl::Reference(this_01);
  (this->super_TPZCompEl).fReferenceIndex = pTVar5->fIndex;
  TPZCompEl::SetIndex(&this->super_TPZCompEl,this_01->fIndex);
  ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                      (&(((this->super_TPZCompEl).fMesh)->fElementVec).
                        super_TPZChunkVector<TPZCompEl_*,_10>,(this->super_TPZCompEl).fIndex);
  *ppTVar6 = &this->super_TPZCompEl;
  uVar3 = (**(code **)(*(long *)this_01 + 0x90))(this_01);
  (*(this_00->super_TPZVec<long>)._vptr_TPZVec[3])(this_00,(long)(int)uVar3);
  auVar2 = _DAT_014d28c0;
  if (0 < (int)uVar3) {
    plVar1 = (this->fIndexes).super_TPZVec<long>.fStore;
    lVar7 = (ulong)uVar3 - 1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar9 = auVar9 ^ _DAT_014d28c0;
    auVar10 = _DAT_014d28b0;
    do {
      auVar11 = auVar10 ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        plVar1[uVar8] = uVar8;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        plVar1[uVar8 + 1] = uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar7 + 2;
    } while ((uVar3 + 1 & 0xfffffffe) != uVar8);
  }
  return;
}

Assistant:

TPZCondensedCompEl::TPZCondensedCompEl(const TPZCondensedCompEl &copy, TPZCompMesh &mesh) : TPZRegisterClassId(&TPZCondensedCompEl::ClassId)
{
    TPZCompEl *ref = fReferenceCompEl->Clone(mesh);
    if(!ref)
    {
        DebugStop();
    }
    fReferenceCompEl = ref;
    fMesh = ref->Mesh();
    fKeepMatrix = copy.fKeepMatrix;
    SetReference(ref->Reference()->Index());
    SetIndex(ref->Index());
    fMesh->ElementVec()[fIndex] = this;
    int ncon = ref->NConnects();
    fIndexes.resize(ncon);
    for (int i=0; i<ncon ; ++i) {
        fIndexes[i] = i;
    }
}